

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int patchtestreg(FuncState *fs,int node,int reg)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  
  puVar3 = fs->f->code + node;
  if ((0 < node) && ((char)luaP_opmodes[puVar3[-1] & 0x3f] < '\0')) {
    puVar3 = puVar3 + -1;
  }
  uVar4 = *puVar3;
  iVar1 = 0;
  if ((uVar4 & 0x3f) == 0x23) {
    if ((reg == 0xff) || (uVar4 >> 0x17 == reg)) {
      uVar2 = uVar4 >> 0x11 & 0xffffffc0;
      uVar4 = uVar4 & 0x7fc022;
    }
    else {
      uVar4 = uVar4 & 0xffffc023;
      uVar2 = (reg & 0xffU) << 6;
    }
    *puVar3 = uVar4 | uVar2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int patchtestreg(FuncState *fs, int node, int reg) {
    Instruction *i = getjumpcontrol(fs, node);
    if (GET_OPCODE(*i) != OP_TESTSET)
        return 0;  /* cannot patch other instructions */
    if (reg != NO_REG && reg != GETARG_B(*i))
        SETARG_A(*i, reg);
    else {
        /* no register to put value or register already has the value;
           change instruction to simple test */
        *i = CREATE_ABC(OP_TEST, GETARG_B(*i), 0, GETARG_C(*i));
    }
    return 1;
}